

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatSolver.c
# Opt level: O0

void xSAT_SolverGarbageCollect(xSAT_Solver_t *s)

{
  Vec_Int_t *p;
  xSAT_Mem_t *pSrc;
  uint uVar1;
  uint uVar2;
  int iVar3;
  xSAT_Mem_t *pDest;
  xSAT_WatchList_t *pxVar4;
  xSAT_Watcher_t *pxVar5;
  int *piVar6;
  xSAT_Watcher_t *local_48;
  xSAT_Watcher_t *w;
  xSAT_Watcher_t *end;
  xSAT_Watcher_t *begin;
  xSAT_WatchList_t *ws;
  xSAT_Mem_t *pNewMemMngr;
  uint *pArray;
  int i;
  xSAT_Solver_t *s_local;
  
  uVar1 = xSAT_MemCap(s->pMemory);
  uVar2 = xSAT_MemWastedCap(s->pMemory);
  pDest = xSAT_MemAlloc(uVar1 - uVar2);
  pArray._4_4_ = 0;
  while( true ) {
    iVar3 = Vec_StrSize(s->vAssigns);
    if (SBORROW4(pArray._4_4_,iVar3 * 2) == pArray._4_4_ + iVar3 * -2 < 0) break;
    pxVar4 = xSAT_VecWatchListEntry(s->vWatches,pArray._4_4_);
    local_48 = xSAT_WatchListArray(pxVar4);
    iVar3 = xSAT_WatchListSize(pxVar4);
    pxVar5 = local_48 + iVar3;
    for (; local_48 != pxVar5; local_48 = local_48 + 1) {
      xSAT_SolverClaRealloc(pDest,s->pMemory,&local_48->CRef);
    }
    pxVar4 = xSAT_VecWatchListEntry(s->vBinWatches,pArray._4_4_);
    local_48 = xSAT_WatchListArray(pxVar4);
    iVar3 = xSAT_WatchListSize(pxVar4);
    pxVar5 = local_48 + iVar3;
    for (; local_48 != pxVar5; local_48 = local_48 + 1) {
      xSAT_SolverClaRealloc(pDest,s->pMemory,&local_48->CRef);
    }
    pArray._4_4_ = pArray._4_4_ + 1;
  }
  pArray._4_4_ = 0;
  while( true ) {
    iVar3 = Vec_IntSize(s->vTrail);
    if (iVar3 <= pArray._4_4_) break;
    p = s->vReasons;
    iVar3 = Vec_IntEntry(s->vTrail,pArray._4_4_);
    iVar3 = xSAT_Lit2Var(iVar3);
    iVar3 = Vec_IntEntry(p,iVar3);
    if (iVar3 != -1) {
      pSrc = s->pMemory;
      piVar6 = Vec_IntArray(s->vReasons);
      iVar3 = Vec_IntEntry(s->vTrail,pArray._4_4_);
      iVar3 = xSAT_Lit2Var(iVar3);
      xSAT_SolverClaRealloc(pDest,pSrc,(uint *)(piVar6 + iVar3));
    }
    pArray._4_4_ = pArray._4_4_ + 1;
  }
  piVar6 = Vec_IntArray(s->vLearnts);
  pArray._4_4_ = 0;
  while( true ) {
    iVar3 = Vec_IntSize(s->vLearnts);
    if (iVar3 <= pArray._4_4_) break;
    xSAT_SolverClaRealloc(pDest,s->pMemory,(uint *)(piVar6 + pArray._4_4_));
    pArray._4_4_ = pArray._4_4_ + 1;
  }
  piVar6 = Vec_IntArray(s->vClauses);
  pArray._4_4_ = 0;
  while( true ) {
    iVar3 = Vec_IntSize(s->vClauses);
    if (iVar3 <= pArray._4_4_) break;
    xSAT_SolverClaRealloc(pDest,s->pMemory,(uint *)(piVar6 + pArray._4_4_));
    pArray._4_4_ = pArray._4_4_ + 1;
  }
  xSAT_MemFree(s->pMemory);
  s->pMemory = pDest;
  return;
}

Assistant:

void xSAT_SolverGarbageCollect( xSAT_Solver_t * s )
{
    int i;
    unsigned * pArray;
    xSAT_Mem_t * pNewMemMngr = xSAT_MemAlloc(  xSAT_MemCap( s->pMemory ) - xSAT_MemWastedCap( s->pMemory ) );

    for ( i = 0; i < 2 * Vec_StrSize( s->vAssigns ); i++ )
    {
        xSAT_WatchList_t* ws = xSAT_VecWatchListEntry( s->vWatches, i);
        xSAT_Watcher_t* begin = xSAT_WatchListArray(ws);
        xSAT_Watcher_t* end   = begin + xSAT_WatchListSize(ws);
        xSAT_Watcher_t *w;

        for ( w = begin; w != end; w++ )
            xSAT_SolverClaRealloc( pNewMemMngr, s->pMemory, &(w->CRef) );

        ws = xSAT_VecWatchListEntry( s->vBinWatches, i);
        begin = xSAT_WatchListArray(ws);
        end   = begin + xSAT_WatchListSize(ws);
        for ( w = begin; w != end; w++ )
            xSAT_SolverClaRealloc( pNewMemMngr, s->pMemory, &(w->CRef) );
    }

    for ( i = 0; i < Vec_IntSize( s->vTrail ); i++ )
        if ( ( unsigned ) Vec_IntEntry( s->vReasons, xSAT_Lit2Var( Vec_IntEntry( s->vTrail, i ) ) ) != CRefUndef )
            xSAT_SolverClaRealloc( pNewMemMngr, s->pMemory, ( unsigned * ) &( Vec_IntArray( s->vReasons )[xSAT_Lit2Var( Vec_IntEntry( s->vTrail, i ) )] ) );

    pArray = ( unsigned * ) Vec_IntArray( s->vLearnts );
    for ( i = 0; i < Vec_IntSize( s->vLearnts ); i++ )
        xSAT_SolverClaRealloc( pNewMemMngr, s->pMemory, &(pArray[i]) );

    pArray = ( unsigned * ) Vec_IntArray( s->vClauses );
    for ( i = 0; i < Vec_IntSize( s->vClauses ); i++ )
        xSAT_SolverClaRealloc( pNewMemMngr, s->pMemory, &(pArray[i]) );

    xSAT_MemFree( s->pMemory );
    s->pMemory = pNewMemMngr;
}